

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPhase.hpp
# Opt level: O1

void __thiscall
qclab::qgates::CPhase<std::complex<double>_>::CPhase
          (CPhase<std::complex<double>_> *this,int control,int target,real_type theta,
          int controlState)

{
  Phase<std::complex<double>_> *this_00;
  char *__assertion;
  
  QControlledGate2<std::complex<double>_>::QControlledGate2
            (&this->super_QControlledGate2<std::complex<double>_>,control,controlState);
  (this->super_QControlledGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_00127ff8;
  this_00 = (Phase<std::complex<double>_> *)operator_new(0x20);
  Phase<std::complex<double>_>::Phase(this_00,target,theta,false);
  (this->gate_)._M_t.
  super___uniq_ptr_impl<qclab::qgates::Phase<std::complex<double>_>,_std::default_delete<qclab::qgates::Phase<std::complex<double>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_qclab::qgates::Phase<std::complex<double>_>_*,_std::default_delete<qclab::qgates::Phase<std::complex<double>_>_>_>
  .super__Head_base<0UL,_qclab::qgates::Phase<std::complex<double>_>_*,_false>._M_head_impl =
       this_00;
  if (control < 0) {
    __assertion = "control >= 0";
  }
  else {
    if (-1 < target) {
      if (target != control) {
        return;
      }
      __assert_fail("control != target",
                    "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/include/qclab/qgates/CPhase.hpp"
                    ,0x41,
                    "qclab::qgates::CPhase<std::complex<double>>::CPhase(const int, const int, const real_type, const int) [T = std::complex<double>]"
                   );
    }
    __assertion = "target >= 0";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/include/qclab/qgates/CPhase.hpp"
                ,0x40,
                "qclab::qgates::CPhase<std::complex<double>>::CPhase(const int, const int, const real_type, const int) [T = std::complex<double>]"
               );
}

Assistant:

CPhase( const int control , const int target , const real_type theta ,
                const int controlState = 1 )
        : QControlledGate2< T >( control , controlState )
        , gate_( std::make_unique< Phase< T > >( target , theta ) )
        {
          assert( control >= 0 ) ; assert( target >= 0 ) ;
          assert( control != target ) ;
        }